

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O2

Node * __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::buildKDTree(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
              *this,vector<int_*,_std::allocator<int_*>_> *values,uint depth)

{
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> _Var1;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> __last;
  int *piVar2;
  value_type piVar3;
  Node *node;
  Node *pNVar4;
  Node *pNVar5;
  reference ppiVar6;
  uint uVar7;
  ulong __n;
  undefined1 local_70 [8];
  vector<int_*,_std::allocator<int_*>_> leftValues;
  vector<int_*,_std::allocator<int_*>_> rightValues;
  allocator_type local_35;
  uint local_34 [2];
  uint depth_local;
  
  _Var1._M_current =
       (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  __last._M_current =
       (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  uVar7 = (uint)((long)__last._M_current - (long)_Var1._M_current >> 3);
  local_34[0] = depth;
  if (uVar7 == 1) {
    node = (Node *)operator_new(0x18);
    piVar2 = *_Var1._M_current;
    node->left = (Node *)0x0;
    node->right = (Node *)0x0;
    node->value = piVar2;
  }
  else if ((int)uVar7 < 1) {
    node = (Node *)0x0;
  }
  else {
    __n = (ulong)(uVar7 >> 1 & 0x3fffffff);
    std::
    __partial_sort<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,__gnu_cxx::__ops::_Iter_comp_iter<kdtree::KDTree<int,5u,kdtree::default_new<int,5>,kdtree::default_delete<int>,kdtree::default_set<int>,kdtree::default_less<int>>::buildKDTree(std::vector<int*,std::allocator<int*>>&,unsigned_int)::_lambda(int*,int*)_1_>>
              (_Var1,(__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                     (_Var1._M_current + __n + 1),__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_schenker[P]KDTree_KDTree_hpp:81:6)>
                )local_34);
    _Var1._M_current =
         (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.super__Vector_impl_data
         ._M_start;
    std::vector<int*,std::allocator<int*>>::
    vector<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,void>
              ((vector<int*,std::allocator<int*>> *)local_70,_Var1,
               (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
               (_Var1._M_current + __n),
               (allocator_type *)
               &leftValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int*,std::allocator<int*>>::
    vector<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,void>
              ((vector<int*,std::allocator<int*>> *)
               &leftValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
               ((values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
                super__Vector_impl_data._M_start + __n),
               (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
               (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,&local_35);
    pNVar4 = buildKDTree(this,(vector<int_*,_std::allocator<int_*>_> *)local_70,local_34[0] + 1);
    pNVar5 = buildKDTree(this,(vector<int_*,_std::allocator<int_*>_> *)
                              &leftValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,local_34[0] + 1);
    node = (Node *)operator_new(0x18);
    ppiVar6 = std::vector<int_*,_std::allocator<int_*>_>::at(values,__n);
    piVar3 = *ppiVar6;
    node->left = pNVar4;
    node->right = pNVar5;
    node->value = piVar3;
    std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
              ((_Vector_base<int_*,_std::allocator<int_*>_> *)
               &leftValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
              ((_Vector_base<int_*,_std::allocator<int_*>_> *)local_70);
  }
  updateBoundingBox(this,node);
  return node;
}

Assistant:

Node *buildKDTree(std::vector<T*> &values, const unsigned int depth = 0) {
			Node *result;

			const int numberOfValues = values.size();

			if (numberOfValues == 1) {
				result = new Node(values.front());
			}
			else if (numberOfValues > 0) {

				std::partial_sort(values.begin(), values.begin() + (numberOfValues / 2) + 1, values.end(),
					[&depth](T *i, T *j) {
					return LESS()(i, j, depth%dim);
				});

				const int pivot = numberOfValues / 2;

				std::vector<T*> leftValues(values.begin(), values.begin() + pivot);
				std::vector<T*> rightValues(values.begin() + pivot, values.end());

				Node *leftNode = buildKDTree(leftValues, depth + 1);
				Node *rightNode = buildKDTree(rightValues, depth + 1);

				result = new Node(values.at(pivot), leftNode, rightNode);
			}
			else { // values.empty()
				result = 0;
			}

			updateBoundingBox(result);

			return result;
		}